

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

void AString_replace(AString *str,char old,char rep,size_t count)

{
  ulong uVar1;
  
  if ((str != (AString *)0x0) && (str->size != 0)) {
    uVar1 = 0;
    do {
      if (str->buffer[uVar1] == old) {
        str->buffer[uVar1] = rep;
        if (count == 0) {
          count = 0;
        }
        else {
          count = count - 1;
          if (count == 0) {
            return;
          }
        }
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < str->size);
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_replace(struct AString *str, char old, char rep, size_t count)
{
    size_t i;
    if(str == nullptr)
        return;
    for(i = 0; i < str->size; ++i) {
        if(str->buffer[i] == old) {
            str->buffer[i] = rep;
            if(count > 0 && --count == 0)
                return;
        }
    }
}